

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

ostream * despot::operator<<(ostream *os,Function *func)

{
  pointer pbVar1;
  char cVar2;
  pointer pmVar3;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *pvVar4;
  pointer ppNVar5;
  ostream *poVar6;
  pointer pdVar7;
  pointer pmVar8;
  _Rb_tree_node_base *p_Var9;
  pointer pvVar10;
  _Self __tmp;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  vector<int,_std::allocator<int>_> index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  vector<int,_std::allocator<int>_> local_a0;
  ulong local_88;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Vars: [",7);
  ppNVar5 = (func->parents_).
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((func->parents_).super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppNVar5) {
    uVar13 = 0;
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(ppNVar5[uVar13]->name_)._M_dataplus._M_p,
                          (ppNVar5[uVar13]->name_)._M_string_length);
      bVar15 = uVar13 == ((long)(func->parents_).
                                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(func->parents_).
                                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U;
      pcVar11 = ", ";
      if (bVar15) {
        pcVar11 = " -> ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar11,(ulong)bVar15 * 2 + 2);
      uVar13 = uVar13 + 1;
      ppNVar5 = (func->parents_).
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(func->parents_).
                                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5 >> 3)
            );
  }
  local_80 = &func->parents_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(func->child_->name_)._M_dataplus._M_p,
                      (func->child_->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  cVar2 = (char)os;
  if ((func->values_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (func->values_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((func->map_).
        super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (func->map_).
        super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        Variable::ComputeIndexVec(&local_a0,local_80,(int)uVar13);
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar14 = 0;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_78,
                        (value_type *)
                        ((long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar14] * 0x20 +
                        *(long *)&((local_80->
                                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar14]->
                                  super_Variable).values_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data));
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)local_a0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,&local_78);
        poVar6 = operator<<(os,&local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        pmVar8 = (func->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pmVar3 = pmVar8 + uVar13;
        p_Var9 = *(_Base_ptr *)((long)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header + 0x10);
        local_88 = uVar13;
        while (uVar14 = local_88, p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header)
        {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          pbVar1 = (func->child_->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,pbVar1[(int)p_Var9[1]._M_color]._M_dataplus._M_p,
                              pbVar1[(int)p_Var9[1]._M_color]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
          std::ostream::_M_insert<double>((double)p_Var9[1]._M_parent);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          pmVar8 = (func->map_).
                   super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pmVar3 = pmVar8 + uVar13;
        }
        if (((long)(func->map_).
                   super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar8 >> 4) *
            -0x5555555555555555 - 1U != local_88) {
          std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar13 = uVar14 + 1;
        uVar14 = ((long)(func->map_).
                        super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(func->map_).
                        super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      } while (uVar13 <= uVar14 && uVar14 - uVar13 != 0);
    }
  }
  else if ((func->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (func->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      pvVar4 = local_80;
      Variable::ComputeIndexVec(&local_a0,local_80,(int)uVar13);
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar14 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,
                      (value_type *)
                      ((long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14] * 0x20 +
                      *(long *)&((pvVar4->
                                 super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14]->super_Variable)
                                .values_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data));
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)local_a0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_a0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_60,&local_78);
      poVar6 = operator<<(os,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      pvVar10 = (func->values_).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar7 = pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88 = uVar13;
      if (*(pointer *)
           ((long)&pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) != pdVar7) {
        lVar12 = 8;
        uVar14 = 0;
        do {
          if ((pdVar7[uVar14] != 0.0) || (NAN(pdVar7[uVar14]))) {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            pbVar1 = (func->child_->super_Variable).values_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,*(char **)((long)pbVar1 + lVar12 + -8),
                                *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar12));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
            std::ostream::_M_insert<double>
                      (*(double *)
                        (*(long *)&(func->values_).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar13].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar14 * 8));
          }
          uVar14 = uVar14 + 1;
          pvVar10 = (func->values_).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar7 = pvVar10[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x20;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar10[uVar13].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pdVar7 >> 3));
      }
      uVar13 = local_88;
      if (((long)(func->values_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) *
          -0x5555555555555555 - 1U != local_88) {
        std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
      uVar14 = ((long)(func->values_).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(func->values_).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar13 <= uVar14 && uVar14 - uVar13 != 0);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Function& func) {
	os << "Vars: [";
	for (int i = 0; i < func.parents_.size(); i++) {
		os << func.parents_[i]->name()
			<< (i == func.parents_.size() - 1 ? " -> " : ", ");
	}
	os << func.child_->name() << "]" << endl; // TODO: should print curr_name here but prev_name above for state variable

	if (func.values_.size() > 0) {
		for (int p = 0; p < func.values_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";
			for (int c = 0; c < func.values_[p].size(); c++) {
				if (func.values_[p][c] != 0)
					os << " " << func.child_->GetValue(c) << ":"
						<< func.values_[p][c];
			}
			if (p != func.values_.size() - 1)
				os << endl;
		}
	} else {
		for (int p = 0; p < func.map_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";

			for (map<int, double>::const_iterator it = func.map_[p].begin();
				it != func.map_[p].end(); it++) {
				os << " " << func.child_->GetValue(it->first) << ":"
					<< it->second;
			}
			if (p != func.map_.size() - 1)
				os << endl;
		}
	}
	return os;
}